

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

Response * __thiscall
slack::_detail::Session::makeRequest(Response *__return_storage_ptr__,Session *this)

{
  undefined8 uVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  long *plVar5;
  ostream *poVar6;
  runtime_error *this_00;
  long *plVar7;
  string error_msg;
  string response_string;
  string header_string;
  allocator local_101;
  undefined8 local_100;
  pthread_mutex_t *local_f8;
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_request_);
  if (iVar2 == 0) {
    local_f8 = (pthread_mutex_t *)&this->mutex_request_;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Content-Type: application/x-www-form-urlencoded","");
    local_100 = curl_slist_append(0,local_70[0]);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    curl_easy_setopt(this->curl_,0x2712,(this->url_)._M_dataplus._M_p);
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    curl_easy_setopt(this->curl_,0x4e2b,writeFunction);
    curl_easy_setopt(this->curl_,0x2711,&local_d0);
    curl_easy_setopt(this->curl_,0x272d,&local_b0);
    CVar3 = curl_easy_perform(this->curl_);
    this->res_ = CVar3;
    local_e8 = 0;
    local_e0[0] = '\0';
    local_f0 = local_e0;
    if (CVar3 != CURLE_OK) {
      pcVar4 = (char *)curl_easy_strerror(CVar3);
      std::__cxx11::string::string((string *)local_50,pcVar4,&local_101);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x121645);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_80 = *plVar7;
        lStack_78 = plVar5[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar7;
        local_90 = (long *)*plVar5;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (this->throw_exception_ == true) goto LAB_00115e7c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[slacking] curl_easy_perform() failed ",0x26);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_f0,local_e8);
      local_90 = (long *)CONCAT71(local_90._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_90,1);
    }
    (__return_storage_ptr__->text)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->text).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_d0,local_d0 + local_c8);
    __return_storage_ptr__->is_error = CVar3 != CURLE_OK;
    (__return_storage_ptr__->error_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_message).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_message,local_f0,local_f0 + local_e8);
    uVar1 = local_100;
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    __mutex = local_f8;
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    curl_slist_free_all(uVar1);
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
LAB_00115e7c:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Response Session::makeRequest() {
    std::lock_guard<std::mutex> lock(mutex_request_);
    
    //------ set our custom set of headers
    // for  using incoming webhook it is mandatory to set 
    // "Content-Type: application/x-www-form-urlencoded" in header

    curl_header  header(curl_);
    header.append("Content-Type: application/x-www-form-urlencoded");
    
    //-------- set our custom set of headers------------------------------  

    curl_easy_setopt(curl_, CURLOPT_URL, url_.c_str());
    
    std::string response_string;
    std::string header_string;
    curl_easy_setopt(curl_, CURLOPT_WRITEFUNCTION, writeFunction);
    curl_easy_setopt(curl_, CURLOPT_WRITEDATA, &response_string);
    curl_easy_setopt(curl_, CURLOPT_HEADERDATA, &header_string);

    res_ = curl_easy_perform(curl_);

    bool is_error = false;
    std::string error_msg{};
    if(res_ != CURLE_OK) {
        is_error = true;
        error_msg = "curl_easy_perform() failed " + std::string{curl_easy_strerror(res_)};
        if (throw_exception_) 
            throw std::runtime_error(error_msg);
        else 
            std::cerr << "[slacking] curl_easy_perform() failed " << error_msg << '\n';
    }

    return { response_string, is_error, error_msg };
}